

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O2

void __thiscall MeCab::scoped_ptr<MeCab::ContextID>::~scoped_ptr(scoped_ptr<MeCab::ContextID> *this)

{
  ~scoped_ptr(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~scoped_ptr() { delete ptr_; }